

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::operator==(MP<8UL,_GF2::MOGrevlex<8UL>_> *this,bool cRight)

{
  size_t sVar1;
  WW<8UL> *this_00;
  byte in_SIL;
  _List_const_iterator<GF2::MM<8UL>_> *in_RDI;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  bool bVar2;
  
  if ((in_SIL & 1) == 0) {
    bVar2 = IsEmpty((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1cebc5);
  }
  else {
    sVar1 = Size((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1ceb7d);
    bVar2 = false;
    if (sVar1 == 1) {
      std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                ((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
                 (ulong)CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8));
      this_00 = &std::_List_const_iterator<GF2::MM<8UL>_>::operator->(in_RDI)->super_WW<8UL>;
      bVar2 = WW<8UL>::IsAllZero(this_00);
    }
  }
  return bVar2;
}

Assistant:

bool operator==(bool cRight) const
	{	
		return cRight ? Size() == 1 && begin()->IsAllZero() : IsEmpty();
	}